

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O3

size_t __thiscall optimization::global_expr_move::hasher::operator()(hasher *this,Op *p)

{
  undefined1 *puVar1;
  uint uVar2;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar3;
  uint32_t *puVar4;
  
  puVar1 = &(p->lhs).field_0x8;
  if ((p->lhs).field_0x18 == '\0') {
    puVar4 = (uint32_t *)
             std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)puVar1);
  }
  else {
    pvVar3 = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)puVar1);
    puVar4 = &pvVar3->id;
  }
  uVar2 = *puVar4;
  puVar1 = &(p->rhs).field_0x8;
  if ((p->rhs).field_0x18 == '\0') {
    puVar4 = (uint32_t *)
             std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)puVar1);
  }
  else {
    pvVar3 = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)puVar1);
    puVar4 = &pvVar3->id;
  }
  return (long)(int)(uVar2 ^ *puVar4);
}

Assistant:

size_t operator()(const Op& p) const {
    int lhs = p.lhs.index() == 0 ? std::get<int>(p.lhs)
                                 : std::get<mir::inst::VarId>(p.lhs).id;
    int rhs = p.rhs.index() == 0 ? std::get<int>(p.rhs)
                                 : std::get<mir::inst::VarId>(p.rhs).id;

    return std::hash<int>()(lhs) ^ std::hash<int>()(rhs);
  }